

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O0

void If_LibBoxFree(If_LibBox_t *p)

{
  int iVar1;
  If_Box_t *p_00;
  int local_1c;
  int i;
  If_Box_t *pBox;
  If_LibBox_t *p_local;
  
  if (p != (If_LibBox_t *)0x0) {
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vBoxes), local_1c < iVar1; local_1c = local_1c + 1) {
      p_00 = (If_Box_t *)Vec_PtrEntry(p->vBoxes,local_1c);
      if (p_00 != (If_Box_t *)0x0) {
        If_BoxFree(p_00);
      }
    }
    Vec_PtrFree(p->vBoxes);
    if (p != (If_LibBox_t *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void If_LibBoxFree( If_LibBox_t * p )
{
    If_Box_t * pBox;
    int i;
    if ( p == NULL )
        return;
    If_LibBoxForEachBox( p, pBox, i )
        If_BoxFree( pBox );
    Vec_PtrFree( p->vBoxes );
    ABC_FREE( p );
}